

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

int __thiscall btSoftBody::generateClusters(btSoftBody *this,int k,int maxiterations)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  uint uVar4;
  Cluster **ppCVar5;
  Node **ppNVar6;
  Tetra *pTVar7;
  Face *pFVar8;
  bool *pbVar9;
  Cluster *pCVar10;
  Cluster **ppCVar11;
  long lVar12;
  Cluster *pCVar13;
  Node **ppNVar14;
  btVector3 *pbVar15;
  btScalar *pbVar16;
  int *__s;
  bool *pbVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  int q;
  int iVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  Cluster *cla;
  int j;
  Node *pNVar30;
  ulong uVar31;
  int i;
  int iVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  btAlignedObjectArray<btVector3> centers;
  btAlignedObjectArray<int> cids;
  int idx [3];
  float local_108;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  btAlignedObjectArray<btVector3> local_e0;
  btAlignedObjectArray<int> local_c0;
  int local_9c;
  float local_98;
  int local_94 [3];
  undefined8 local_88;
  undefined8 uStack_80;
  ulong local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar29 = (ulong)(uint)k;
  iVar26 = (this->m_clusters).m_size;
  local_9c = maxiterations;
  while (0 < iVar26) {
    releaseCluster(this,0);
    iVar26 = (this->m_clusters).m_size;
  }
  uVar21 = (this->m_nodes).m_size;
  if ((int)uVar21 < k) {
    uVar29 = (ulong)uVar21;
  }
  iVar26 = (this->m_clusters).m_size;
  lVar22 = (long)iVar26;
  iVar25 = (int)uVar29;
  if ((iVar26 <= iVar25) && (iVar26 < iVar25)) {
    if ((this->m_clusters).m_capacity < iVar25) {
      if (iVar25 == 0) {
        ppCVar11 = (Cluster **)0x0;
      }
      else {
        ppCVar11 = (Cluster **)btAlignedAllocInternal((long)iVar25 << 3,0x10);
      }
      lVar12 = (long)(this->m_clusters).m_size;
      if (0 < lVar12) {
        lVar18 = 0;
        do {
          ppCVar11[lVar18] = (this->m_clusters).m_data[lVar18];
          lVar18 = lVar18 + 1;
        } while (lVar12 != lVar18);
      }
      ppCVar5 = (this->m_clusters).m_data;
      if (ppCVar5 != (Cluster **)0x0) {
        if ((this->m_clusters).m_ownsMemory == true) {
          btAlignedFreeInternal(ppCVar5);
        }
        (this->m_clusters).m_data = (Cluster **)0x0;
      }
      (this->m_clusters).m_ownsMemory = true;
      (this->m_clusters).m_data = ppCVar11;
      (this->m_clusters).m_capacity = iVar25;
    }
    if (iVar26 < iVar25) {
      do {
        (this->m_clusters).m_data[lVar22] = (Cluster *)0x0;
        lVar22 = lVar22 + 1;
      } while (iVar25 != lVar22);
    }
  }
  (this->m_clusters).m_size = iVar25;
  if (0 < iVar25) {
    lVar22 = 0;
    do {
      pCVar13 = (Cluster *)btAlignedAllocInternal(0x1a8,0x10);
      (pCVar13->m_masses).m_ownsMemory = true;
      (pCVar13->m_masses).m_data = (float *)0x0;
      (pCVar13->m_masses).m_size = 0;
      (pCVar13->m_masses).m_capacity = 0;
      (pCVar13->m_nodes).m_ownsMemory = true;
      (pCVar13->m_nodes).m_data = (Node **)0x0;
      (pCVar13->m_nodes).m_size = 0;
      (pCVar13->m_nodes).m_capacity = 0;
      (pCVar13->m_framerefs).m_ownsMemory = true;
      (pCVar13->m_framerefs).m_data = (btVector3 *)0x0;
      (pCVar13->m_framerefs).m_size = 0;
      (pCVar13->m_framerefs).m_capacity = 0;
      pCVar13->m_leaf = (btDbvtNode *)0x0;
      pCVar13->m_ndamping = 0.0;
      pCVar13->m_ldamping = 0.0;
      pCVar13->m_adamping = 0.0;
      pCVar13->m_matching = 0.0;
      pCVar13->m_maxSelfCollisionImpulse = 100.0;
      pCVar13->m_selfCollisionImpulseFactor = 0.01;
      pCVar13->m_containsAnchor = false;
      (this->m_clusters).m_data[lVar22] = pCVar13;
      (this->m_clusters).m_data[lVar22]->m_collide = true;
      lVar22 = lVar22 + 1;
      uVar29 = (ulong)(this->m_clusters).m_size;
    } while (lVar22 < (long)uVar29);
  }
  iVar26 = (int)uVar29;
  if (iVar26 < 1) {
    iVar25 = (this->m_tetras).m_size;
    lVar22 = (long)iVar25;
    if (lVar22 == 0) {
      iVar25 = (this->m_faces).m_size;
      if ((iVar26 <= iVar25) && (iVar26 < iVar25)) {
        if ((this->m_clusters).m_capacity < iVar25) {
          if (iVar25 == 0) {
            ppCVar11 = (Cluster **)0x0;
          }
          else {
            ppCVar11 = (Cluster **)btAlignedAllocInternal((long)iVar25 * 8,0x10);
          }
          lVar22 = (long)(this->m_clusters).m_size;
          if (0 < lVar22) {
            lVar12 = 0;
            do {
              ppCVar11[lVar12] = (this->m_clusters).m_data[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar22 != lVar12);
          }
          ppCVar5 = (this->m_clusters).m_data;
          if (ppCVar5 != (Cluster **)0x0) {
            if ((this->m_clusters).m_ownsMemory == true) {
              btAlignedFreeInternal(ppCVar5);
            }
            (this->m_clusters).m_data = (Cluster **)0x0;
          }
          (this->m_clusters).m_ownsMemory = true;
          (this->m_clusters).m_data = ppCVar11;
          (this->m_clusters).m_capacity = iVar25;
        }
        if (iVar26 < iVar25) {
          lVar22 = (long)iVar26;
          do {
            (this->m_clusters).m_data[lVar22] = (Cluster *)0x0;
            lVar22 = lVar22 + 1;
          } while (iVar25 != lVar22);
        }
      }
      (this->m_clusters).m_size = iVar25;
      if (0 < iVar25) {
        lVar22 = 0;
        do {
          pCVar13 = (Cluster *)btAlignedAllocInternal(0x1a8,0x10);
          (pCVar13->m_masses).m_ownsMemory = true;
          (pCVar13->m_masses).m_data = (float *)0x0;
          (pCVar13->m_masses).m_size = 0;
          (pCVar13->m_masses).m_capacity = 0;
          (pCVar13->m_nodes).m_ownsMemory = true;
          (pCVar13->m_nodes).m_data = (Node **)0x0;
          (pCVar13->m_nodes).m_size = 0;
          (pCVar13->m_nodes).m_capacity = 0;
          (pCVar13->m_framerefs).m_ownsMemory = true;
          (pCVar13->m_framerefs).m_data = (btVector3 *)0x0;
          (pCVar13->m_framerefs).m_size = 0;
          (pCVar13->m_framerefs).m_capacity = 0;
          pCVar13->m_leaf = (btDbvtNode *)0x0;
          pCVar13->m_ndamping = 0.0;
          pCVar13->m_ldamping = 0.0;
          pCVar13->m_adamping = 0.0;
          pCVar13->m_matching = 0.0;
          pCVar13->m_maxSelfCollisionImpulse = 100.0;
          pCVar13->m_selfCollisionImpulseFactor = 0.01;
          pCVar13->m_containsAnchor = false;
          (this->m_clusters).m_data[lVar22] = pCVar13;
          (this->m_clusters).m_data[lVar22]->m_collide = true;
          lVar22 = lVar22 + 1;
        } while (lVar22 < (this->m_clusters).m_size);
      }
      if (0 < (this->m_faces).m_size) {
        lVar22 = 0;
        do {
          lVar12 = 0;
          do {
            pCVar13 = (this->m_clusters).m_data[lVar22];
            pFVar8 = (this->m_faces).m_data;
            iVar26 = (pCVar13->m_nodes).m_size;
            iVar25 = (pCVar13->m_nodes).m_capacity;
            if (iVar26 == iVar25) {
              iVar32 = iVar26 * 2;
              if (iVar26 == 0) {
                iVar32 = 1;
              }
              if (iVar25 < iVar32) {
                if (iVar32 == 0) {
                  ppNVar14 = (Node **)0x0;
                }
                else {
                  ppNVar14 = (Node **)btAlignedAllocInternal((long)iVar32 << 3,0x10);
                }
                lVar18 = (long)(pCVar13->m_nodes).m_size;
                if (0 < lVar18) {
                  lVar19 = 0;
                  do {
                    ppNVar14[lVar19] = (pCVar13->m_nodes).m_data[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar18 != lVar19);
                }
                ppNVar6 = (pCVar13->m_nodes).m_data;
                if (ppNVar6 != (Node **)0x0) {
                  if ((pCVar13->m_nodes).m_ownsMemory == true) {
                    btAlignedFreeInternal(ppNVar6);
                  }
                  (pCVar13->m_nodes).m_data = (Node **)0x0;
                }
                (pCVar13->m_nodes).m_ownsMemory = true;
                (pCVar13->m_nodes).m_data = ppNVar14;
                (pCVar13->m_nodes).m_capacity = iVar32;
              }
            }
            iVar26 = (pCVar13->m_nodes).m_size;
            (pCVar13->m_nodes).m_data[iVar26] = pFVar8[lVar22].m_n[lVar12];
            (pCVar13->m_nodes).m_size = iVar26 + 1;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          lVar22 = lVar22 + 1;
        } while (lVar22 < (this->m_faces).m_size);
      }
    }
    else {
      if ((iVar26 <= iVar25) && (iVar26 < iVar25)) {
        if ((this->m_clusters).m_capacity < iVar25) {
          ppCVar11 = (Cluster **)btAlignedAllocInternal(lVar22 * 8,0x10);
          lVar12 = (long)(this->m_clusters).m_size;
          if (0 < lVar12) {
            lVar18 = 0;
            do {
              ppCVar11[lVar18] = (this->m_clusters).m_data[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar12 != lVar18);
          }
          ppCVar5 = (this->m_clusters).m_data;
          if (ppCVar5 != (Cluster **)0x0) {
            if ((this->m_clusters).m_ownsMemory == true) {
              btAlignedFreeInternal(ppCVar5);
            }
            (this->m_clusters).m_data = (Cluster **)0x0;
          }
          (this->m_clusters).m_ownsMemory = true;
          (this->m_clusters).m_data = ppCVar11;
          (this->m_clusters).m_capacity = iVar25;
        }
        if (iVar26 < iVar25) {
          lVar12 = (long)iVar26;
          do {
            (this->m_clusters).m_data[lVar12] = (Cluster *)0x0;
            lVar12 = lVar12 + 1;
          } while (lVar22 != lVar12);
        }
      }
      (this->m_clusters).m_size = iVar25;
      if (0 < iVar25) {
        lVar22 = 0;
        do {
          pCVar13 = (Cluster *)btAlignedAllocInternal(0x1a8,0x10);
          (pCVar13->m_masses).m_ownsMemory = true;
          (pCVar13->m_masses).m_data = (float *)0x0;
          (pCVar13->m_masses).m_size = 0;
          (pCVar13->m_masses).m_capacity = 0;
          (pCVar13->m_nodes).m_ownsMemory = true;
          (pCVar13->m_nodes).m_data = (Node **)0x0;
          (pCVar13->m_nodes).m_size = 0;
          (pCVar13->m_nodes).m_capacity = 0;
          (pCVar13->m_framerefs).m_ownsMemory = true;
          (pCVar13->m_framerefs).m_data = (btVector3 *)0x0;
          (pCVar13->m_framerefs).m_size = 0;
          (pCVar13->m_framerefs).m_capacity = 0;
          pCVar13->m_leaf = (btDbvtNode *)0x0;
          pCVar13->m_ndamping = 0.0;
          pCVar13->m_ldamping = 0.0;
          pCVar13->m_adamping = 0.0;
          pCVar13->m_matching = 0.0;
          pCVar13->m_maxSelfCollisionImpulse = 100.0;
          pCVar13->m_selfCollisionImpulseFactor = 0.01;
          pCVar13->m_containsAnchor = false;
          (this->m_clusters).m_data[lVar22] = pCVar13;
          (this->m_clusters).m_data[lVar22]->m_collide = true;
          lVar22 = lVar22 + 1;
        } while (lVar22 < (this->m_clusters).m_size);
      }
      if (0 < (this->m_tetras).m_size) {
        lVar22 = 0;
        do {
          lVar12 = 0;
          do {
            pCVar13 = (this->m_clusters).m_data[lVar22];
            pTVar7 = (this->m_tetras).m_data;
            iVar26 = (pCVar13->m_nodes).m_size;
            iVar25 = (pCVar13->m_nodes).m_capacity;
            if (iVar26 == iVar25) {
              iVar32 = iVar26 * 2;
              if (iVar26 == 0) {
                iVar32 = 1;
              }
              if (iVar25 < iVar32) {
                if (iVar32 == 0) {
                  ppNVar14 = (Node **)0x0;
                }
                else {
                  ppNVar14 = (Node **)btAlignedAllocInternal((long)iVar32 << 3,0x10);
                }
                lVar18 = (long)(pCVar13->m_nodes).m_size;
                if (0 < lVar18) {
                  lVar19 = 0;
                  do {
                    ppNVar14[lVar19] = (pCVar13->m_nodes).m_data[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar18 != lVar19);
                }
                ppNVar6 = (pCVar13->m_nodes).m_data;
                if (ppNVar6 != (Node **)0x0) {
                  if ((pCVar13->m_nodes).m_ownsMemory == true) {
                    btAlignedFreeInternal(ppNVar6);
                  }
                  (pCVar13->m_nodes).m_data = (Node **)0x0;
                }
                (pCVar13->m_nodes).m_ownsMemory = true;
                (pCVar13->m_nodes).m_data = ppNVar14;
                (pCVar13->m_nodes).m_capacity = iVar32;
              }
            }
            iVar26 = (pCVar13->m_nodes).m_size;
            (pCVar13->m_nodes).m_data[iVar26] = pTVar7[lVar22].m_n[lVar12];
            (pCVar13->m_nodes).m_size = iVar26 + 1;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
          lVar22 = lVar22 + 1;
        } while (lVar22 < (this->m_tetras).m_size);
      }
    }
  }
  else {
    local_e0.m_ownsMemory = true;
    local_e0.m_data = (btVector3 *)0x0;
    local_e0.m_size = 0;
    local_e0.m_capacity = 0;
    iVar25 = (this->m_nodes).m_size;
    if (iVar25 < 1) {
      local_f8 = (undefined1  [8])0x0;
      local_108 = 0.0;
    }
    else {
      _local_f8 = ZEXT816(0);
      local_108 = 0.0;
      lVar22 = 0;
      do {
        pNVar30 = (this->m_nodes).m_data;
        local_108 = local_108 + pNVar30[lVar22].m_x.m_floats[2];
        local_88 = *(ulong *)pNVar30[lVar22].m_x.m_floats;
        uStack_80 = 0;
        pCVar13 = (this->m_clusters).m_data
                  [(long)((int)lVar22 * 0x74b1) % (long)(this->m_clusters).m_size & 0xffffffff];
        iVar25 = (pCVar13->m_nodes).m_size;
        iVar32 = (pCVar13->m_nodes).m_capacity;
        if (iVar25 == iVar32) {
          iVar24 = iVar25 * 2;
          if (iVar25 == 0) {
            iVar24 = 1;
          }
          if (iVar32 < iVar24) {
            if (iVar24 == 0) {
              ppNVar14 = (Node **)0x0;
            }
            else {
              ppNVar14 = (Node **)btAlignedAllocInternal((long)iVar24 << 3,0x10);
            }
            lVar12 = (long)(pCVar13->m_nodes).m_size;
            if (0 < lVar12) {
              lVar18 = 0;
              do {
                ppNVar14[lVar18] = (pCVar13->m_nodes).m_data[lVar18];
                lVar18 = lVar18 + 1;
              } while (lVar12 != lVar18);
            }
            ppNVar6 = (pCVar13->m_nodes).m_data;
            if (ppNVar6 != (Node **)0x0) {
              if ((pCVar13->m_nodes).m_ownsMemory == true) {
                btAlignedFreeInternal(ppNVar6);
              }
              (pCVar13->m_nodes).m_data = (Node **)0x0;
            }
            (pCVar13->m_nodes).m_ownsMemory = true;
            (pCVar13->m_nodes).m_data = ppNVar14;
            (pCVar13->m_nodes).m_capacity = iVar24;
          }
        }
        local_f8._4_4_ = (float)local_f8._4_4_ + local_88._4_4_;
        local_f8._0_4_ = (float)local_f8._0_4_ + (float)local_88;
        fStack_f0 = fStack_f0 + (float)uStack_80;
        fStack_ec = fStack_ec + uStack_80._4_4_;
        iVar25 = (pCVar13->m_nodes).m_size;
        (pCVar13->m_nodes).m_data[iVar25] = pNVar30 + lVar22;
        (pCVar13->m_nodes).m_size = iVar25 + 1;
        lVar22 = lVar22 + 1;
        iVar25 = (this->m_nodes).m_size;
      } while (lVar22 < iVar25);
    }
    iVar32 = local_e0.m_size;
    lVar22 = (long)local_e0.m_size;
    if (local_e0.m_size <= iVar26) {
      if ((local_e0.m_size < iVar26) && (local_e0.m_capacity < iVar26)) {
        pbVar15 = (btVector3 *)btAlignedAllocInternal((uVar29 & 0xffffffff) << 4,0x10);
        if (0 < (long)local_e0.m_size) {
          lVar12 = 0;
          do {
            puVar1 = (undefined8 *)((long)(local_e0.m_data)->m_floats + lVar12);
            uVar3 = puVar1[1];
            puVar2 = (undefined8 *)((long)pbVar15->m_floats + lVar12);
            *puVar2 = *puVar1;
            puVar2[1] = uVar3;
            lVar12 = lVar12 + 0x10;
          } while ((long)local_e0.m_size * 0x10 != lVar12);
        }
        if ((local_e0.m_data != (btVector3 *)0x0) && (local_e0.m_ownsMemory == true)) {
          btAlignedFreeInternal(local_e0.m_data);
        }
        local_e0.m_ownsMemory = true;
        local_e0._4_8_ = uVar29 << 0x20;
        local_e0.m_data = pbVar15;
      }
      if (iVar32 < iVar26) {
        fVar33 = 1.0 / (float)iVar25;
        lVar12 = (uVar29 & 0xffffffff) - lVar22;
        uVar23 = lVar22 << 4 | 0xc;
        do {
          *(ulong *)((long)(local_e0.m_data)->m_floats + (uVar23 - 0xc)) =
               CONCAT44((float)local_f8._4_4_ * fVar33,(float)local_f8._0_4_ * fVar33);
          *(float *)((long)(local_e0.m_data)->m_floats + (uVar23 - 4)) = local_108 * fVar33;
          *(undefined4 *)((long)(local_e0.m_data)->m_floats + uVar23) = 0;
          uVar23 = uVar23 + 0x10;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
    }
    local_e0.m_size = iVar26;
    uVar23 = 1;
    if (1 < iVar26) {
      uVar23 = uVar29 & 0xffffffff;
    }
    uVar27 = 2;
    if (2 < iVar26) {
      uVar27 = uVar29 & 0xffffffff;
    }
    uVar29 = 0;
    local_70 = uVar23;
    do {
      fVar33 = (float)(int)uVar29 * 0.0625;
      local_68 = 1.0;
      if (fVar33 <= 1.0) {
        local_68 = fVar33;
      }
      local_68 = 2.0 - local_68;
      uVar29 = (ulong)((int)uVar29 + 1);
      local_58 = ZEXT416((uint)local_68);
      fStack_64 = local_68;
      fStack_60 = local_68;
      fStack_5c = local_68;
      uVar31 = 0;
      bVar20 = false;
      do {
        pCVar13 = (this->m_clusters).m_data[uVar31];
        iVar25 = (pCVar13->m_nodes).m_size;
        if ((long)iVar25 < 1) {
          fVar35 = 0.0;
          fVar36 = 0.0;
          fVar37 = 0.0;
          fVar38 = 0.0;
          fVar33 = 0.0;
        }
        else {
          fVar33 = 0.0;
          lVar22 = 0;
          fVar35 = 0.0;
          fVar36 = 0.0;
          fVar37 = 0.0;
          fVar38 = 0.0;
          do {
            pNVar30 = (pCVar13->m_nodes).m_data[lVar22];
            uVar3 = *(undefined8 *)(pNVar30->m_x).m_floats;
            fVar35 = fVar35 + (float)uVar3;
            fVar36 = fVar36 + (float)((ulong)uVar3 >> 0x20);
            fVar37 = fVar37 + 0.0;
            fVar38 = fVar38 + 0.0;
            fVar33 = fVar33 + (pNVar30->m_x).m_floats[2];
            lVar22 = lVar22 + 1;
          } while (iVar25 != lVar22);
        }
        if (iVar25 != 0) {
          fVar34 = 1.0 / (float)iVar25;
          local_98 = local_e0.m_data[uVar31].m_floats[2];
          local_48 = *(undefined8 *)local_e0.m_data[uVar31].m_floats;
          fVar39 = (float)((ulong)local_48 >> 0x20);
          uStack_40 = 0;
          fVar35 = (fVar35 * fVar34 - (float)local_48) * local_68 + (float)local_48;
          fVar39 = (fVar36 * fVar34 - fVar39) * fStack_64 + fVar39;
          fVar33 = (fVar33 * fVar34 - local_98) * (float)local_58._0_4_ + local_98;
          local_88 = CONCAT44(fVar39,fVar35);
          uStack_80 = CONCAT44((fVar38 * fVar34 - 0.0) * fStack_5c + 0.0,
                               (fVar37 * fVar34 - 0.0) * fStack_60 + 0.0);
          *(ulong *)local_e0.m_data[uVar31].m_floats = CONCAT44(fVar39,fVar35);
          *(ulong *)(local_e0.m_data[uVar31].m_floats + 2) = (ulong)(uint)fVar33;
          pCVar13 = (this->m_clusters).m_data[uVar31];
          iVar25 = (pCVar13->m_nodes).m_size;
          lVar22 = (long)iVar25;
          if ((lVar22 < 1) && (iVar25 < 0)) {
            if ((pCVar13->m_nodes).m_capacity < 0) {
              ppNVar14 = (pCVar13->m_nodes).m_data;
              if (ppNVar14 != (Node **)0x0) {
                if ((pCVar13->m_nodes).m_ownsMemory == true) {
                  btAlignedFreeInternal(ppNVar14);
                }
                (pCVar13->m_nodes).m_data = (Node **)0x0;
              }
              (pCVar13->m_nodes).m_ownsMemory = true;
              (pCVar13->m_nodes).m_data = (Node **)0x0;
              (pCVar13->m_nodes).m_capacity = 0;
            }
            if (iVar25 < 0) {
              do {
                (pCVar13->m_nodes).m_data[lVar22] = (Node *)0x0;
                lVar22 = lVar22 + 1;
              } while (lVar22 != 0);
            }
          }
          fVar33 = fVar33 - local_98;
          (pCVar13->m_nodes).m_size = 0;
          bVar20 = (bool)(bVar20 | 1.1920929e-07 <
                                   fVar33 * fVar33 +
                                   ((float)local_88 - (float)local_48) *
                                   ((float)local_88 - (float)local_48) +
                                   (local_88._4_4_ - local_48._4_4_) *
                                   (local_88._4_4_ - local_48._4_4_));
        }
        uVar31 = uVar31 + 1;
      } while (uVar31 != uVar23);
      uVar21 = (this->m_nodes).m_size;
      if (0 < (int)uVar21) {
        local_88 = uVar29;
        lVar22 = 0;
        do {
          pNVar30 = (this->m_nodes).m_data;
          if (iVar26 == 1) {
            lVar12 = 0;
          }
          else {
            uVar3 = *(undefined8 *)pNVar30[lVar22].m_x.m_floats;
            fVar36 = (float)uVar3;
            fVar37 = (float)((ulong)uVar3 >> 0x20);
            fVar33 = pNVar30[lVar22].m_x.m_floats[2];
            fVar35 = ABS((local_e0.m_data)->m_floats[2] - fVar33) +
                     ABS((local_e0.m_data)->m_floats[1] - fVar37) +
                     ABS((local_e0.m_data)->m_floats[0] - fVar36);
            pbVar16 = local_e0.m_data[1].m_floats + 2;
            uVar29 = 0;
            uVar23 = 1;
            do {
              fVar38 = ABS(*pbVar16 - fVar33) +
                       ABS((float)((ulong)*(undefined8 *)((btVector3 *)(pbVar16 + -2))->m_floats >>
                                  0x20) - fVar37) +
                       ABS((float)*(undefined8 *)((btVector3 *)(pbVar16 + -2))->m_floats - fVar36);
              if (fVar38 < fVar35) {
                uVar29 = uVar23 & 0xffffffff;
                fVar35 = fVar38;
              }
              uVar23 = uVar23 + 1;
              pbVar16 = pbVar16 + 4;
            } while (uVar27 != uVar23);
            lVar12 = (long)(int)uVar29;
          }
          pCVar13 = (this->m_clusters).m_data[lVar12];
          iVar25 = (pCVar13->m_nodes).m_size;
          iVar32 = (pCVar13->m_nodes).m_capacity;
          if (iVar25 == iVar32) {
            iVar24 = iVar25 * 2;
            if (iVar25 == 0) {
              iVar24 = 1;
            }
            if (iVar32 < iVar24) {
              if (iVar24 == 0) {
                ppNVar14 = (Node **)0x0;
              }
              else {
                ppNVar14 = (Node **)btAlignedAllocInternal((long)iVar24 << 3,0x10);
              }
              lVar12 = (long)(pCVar13->m_nodes).m_size;
              if (0 < lVar12) {
                lVar18 = 0;
                do {
                  ppNVar14[lVar18] = (pCVar13->m_nodes).m_data[lVar18];
                  lVar18 = lVar18 + 1;
                } while (lVar12 != lVar18);
              }
              ppNVar6 = (pCVar13->m_nodes).m_data;
              if (ppNVar6 != (Node **)0x0) {
                if ((pCVar13->m_nodes).m_ownsMemory == true) {
                  btAlignedFreeInternal(ppNVar6);
                }
                (pCVar13->m_nodes).m_data = (Node **)0x0;
              }
              (pCVar13->m_nodes).m_ownsMemory = true;
              (pCVar13->m_nodes).m_data = ppNVar14;
              (pCVar13->m_nodes).m_capacity = iVar24;
            }
          }
          iVar25 = (pCVar13->m_nodes).m_size;
          (pCVar13->m_nodes).m_data[iVar25] = pNVar30 + lVar22;
          (pCVar13->m_nodes).m_size = iVar25 + 1;
          lVar22 = lVar22 + 1;
          uVar21 = (this->m_nodes).m_size;
          uVar23 = local_70;
          uVar29 = local_88;
        } while (lVar22 < (int)uVar21);
      }
    } while ((bVar20) && ((int)uVar29 < local_9c));
    local_c0.m_ownsMemory = true;
    local_c0.m_data = (int *)0x0;
    local_c0.m_size = 0;
    local_c0.m_capacity = 0;
    if ((-1 < (int)uVar21) && (uVar21 != 0)) {
      __s = (int *)btAlignedAllocInternal((ulong)uVar21 * 4,0x10);
      if (0 < (long)local_c0.m_size) {
        lVar22 = 0;
        do {
          __s[lVar22] = local_c0.m_data[lVar22];
          lVar22 = lVar22 + 1;
        } while (local_c0.m_size != lVar22);
      }
      if ((local_c0.m_data != (int *)0x0) && (local_c0.m_ownsMemory == true)) {
        btAlignedFreeInternal(local_c0.m_data);
      }
      local_c0.m_ownsMemory = true;
      local_c0.m_data = __s;
      local_c0.m_capacity = uVar21;
      if (uVar21 != 0) {
        memset(__s,0xff,(ulong)uVar21 << 2);
      }
    }
    local_c0.m_size = uVar21;
    if (0 < (this->m_clusters).m_size) {
      ppCVar11 = (this->m_clusters).m_data;
      pNVar30 = (this->m_nodes).m_data;
      lVar22 = 0;
      do {
        pCVar13 = ppCVar11[lVar22];
        if (0 < (pCVar13->m_nodes).m_size) {
          ppNVar14 = (pCVar13->m_nodes).m_data;
          lVar12 = 0;
          do {
            local_c0.m_data
            [(int)((ulong)((long)ppNVar14[lVar12] - (long)pNVar30) >> 3) * -0x11111111] =
                 (int)lVar22;
            lVar12 = lVar12 + 1;
          } while (lVar12 < (pCVar13->m_nodes).m_size);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 < (this->m_clusters).m_size);
    }
    if (0 < (this->m_faces).m_size) {
      lVar22 = 0;
      do {
        pNVar30 = (this->m_nodes).m_data;
        pFVar8 = (this->m_faces).m_data;
        local_94[0] = (int)((ulong)((long)pFVar8[lVar22].m_n[0] - (long)pNVar30) >> 3) * -0x11111111
        ;
        local_94[1] = (int)((ulong)((long)pFVar8[lVar22].m_n[1] - (long)pNVar30) >> 3) * -0x11111111
        ;
        local_94[2] = (int)((ulong)((long)pFVar8[lVar22].m_n[2] - (long)pNVar30) >> 3) * -0x11111111
        ;
        lVar12 = 0;
        do {
          iVar26 = local_c0.m_data[local_94[lVar12]];
          iVar25 = 1;
          do {
            if (local_c0.m_data[local_94[(uint)((int)lVar12 + iVar25) % 3]] != iVar26) {
              pCVar13 = (this->m_clusters).m_data[iVar26];
              pNVar30 = (this->m_nodes).m_data + local_94[(uint)((int)lVar12 + iVar25) % 3];
              uVar21 = (pCVar13->m_nodes).m_size;
              if (0 < (int)uVar21) {
                uVar29 = 0;
                do {
                  if ((pCVar13->m_nodes).m_data[uVar29] == pNVar30) goto LAB_001df3a3;
                  uVar29 = uVar29 + 1;
                } while (uVar21 != uVar29);
              }
              uVar29 = (ulong)uVar21;
LAB_001df3a3:
              if ((uint)uVar29 == uVar21) {
                uVar4 = (pCVar13->m_nodes).m_capacity;
                if (uVar21 == uVar4) {
                  iVar32 = uVar21 * 2;
                  if ((ulong)uVar21 == 0) {
                    iVar32 = 1;
                  }
                  if ((int)uVar4 < iVar32) {
                    if (iVar32 == 0) {
                      ppNVar14 = (Node **)0x0;
                    }
                    else {
                      ppNVar14 = (Node **)btAlignedAllocInternal((long)iVar32 << 3,0x10);
                    }
                    lVar18 = (long)(pCVar13->m_nodes).m_size;
                    if (0 < lVar18) {
                      lVar19 = 0;
                      do {
                        ppNVar14[lVar19] = (pCVar13->m_nodes).m_data[lVar19];
                        lVar19 = lVar19 + 1;
                      } while (lVar18 != lVar19);
                    }
                    ppNVar6 = (pCVar13->m_nodes).m_data;
                    if (ppNVar6 != (Node **)0x0) {
                      if ((pCVar13->m_nodes).m_ownsMemory == true) {
                        btAlignedFreeInternal(ppNVar6);
                      }
                      (pCVar13->m_nodes).m_data = (Node **)0x0;
                    }
                    (pCVar13->m_nodes).m_ownsMemory = true;
                    (pCVar13->m_nodes).m_data = ppNVar14;
                    (pCVar13->m_nodes).m_capacity = iVar32;
                  }
                }
                iVar32 = (pCVar13->m_nodes).m_size;
                (pCVar13->m_nodes).m_data[iVar32] = pNVar30;
                (pCVar13->m_nodes).m_size = iVar32 + 1;
              }
            }
            iVar25 = iVar25 + 1;
          } while (iVar25 != 3);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        lVar22 = lVar22 + 1;
      } while (lVar22 < (this->m_faces).m_size);
    }
    if (1 < (this->m_clusters).m_size) {
      pCVar13 = (Cluster *)btAlignedAllocInternal(0x1a8,0x10);
      (pCVar13->m_masses).m_ownsMemory = true;
      (pCVar13->m_masses).m_data = (float *)0x0;
      (pCVar13->m_masses).m_size = 0;
      (pCVar13->m_masses).m_capacity = 0;
      (pCVar13->m_nodes).m_ownsMemory = true;
      (pCVar13->m_nodes).m_data = (Node **)0x0;
      (pCVar13->m_nodes).m_size = 0;
      (pCVar13->m_nodes).m_capacity = 0;
      (pCVar13->m_framerefs).m_ownsMemory = true;
      (pCVar13->m_framerefs).m_data = (btVector3 *)0x0;
      (pCVar13->m_framerefs).m_size = 0;
      (pCVar13->m_framerefs).m_capacity = 0;
      pCVar13->m_leaf = (btDbvtNode *)0x0;
      pCVar13->m_ndamping = 0.0;
      pCVar13->m_ldamping = 0.0;
      pCVar13->m_adamping = 0.0;
      pCVar13->m_matching = 0.0;
      pCVar13->m_maxSelfCollisionImpulse = 100.0;
      pCVar13->m_selfCollisionImpulseFactor = 0.01;
      pCVar13->m_containsAnchor = false;
      pCVar13->m_collide = false;
      iVar26 = (this->m_nodes).m_size;
      if (0 < (long)iVar26) {
        if (iVar26 == 0) {
          ppNVar14 = (Node **)0x0;
        }
        else {
          ppNVar14 = (Node **)btAlignedAllocInternal((long)iVar26 << 3,0x10);
        }
        lVar22 = (long)(pCVar13->m_nodes).m_size;
        if (0 < lVar22) {
          lVar12 = 0;
          do {
            ppNVar14[lVar12] = (pCVar13->m_nodes).m_data[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar22 != lVar12);
        }
        ppNVar6 = (pCVar13->m_nodes).m_data;
        if (ppNVar6 != (Node **)0x0) {
          if ((pCVar13->m_nodes).m_ownsMemory == true) {
            btAlignedFreeInternal(ppNVar6);
          }
          (pCVar13->m_nodes).m_data = (Node **)0x0;
        }
        (pCVar13->m_nodes).m_ownsMemory = true;
        (pCVar13->m_nodes).m_data = ppNVar14;
        (pCVar13->m_nodes).m_capacity = iVar26;
      }
      if (0 < (this->m_nodes).m_size) {
        lVar22 = 0;
        do {
          pNVar30 = (this->m_nodes).m_data;
          iVar26 = (pCVar13->m_nodes).m_size;
          iVar25 = (pCVar13->m_nodes).m_capacity;
          if (iVar26 == iVar25) {
            iVar32 = iVar26 * 2;
            if (iVar26 == 0) {
              iVar32 = 1;
            }
            if (iVar25 < iVar32) {
              if (iVar32 == 0) {
                ppNVar14 = (Node **)0x0;
              }
              else {
                ppNVar14 = (Node **)btAlignedAllocInternal((long)iVar32 << 3,0x10);
              }
              lVar12 = (long)(pCVar13->m_nodes).m_size;
              if (0 < lVar12) {
                lVar18 = 0;
                do {
                  ppNVar14[lVar18] = (pCVar13->m_nodes).m_data[lVar18];
                  lVar18 = lVar18 + 1;
                } while (lVar12 != lVar18);
              }
              ppNVar6 = (pCVar13->m_nodes).m_data;
              if (ppNVar6 != (Node **)0x0) {
                if ((pCVar13->m_nodes).m_ownsMemory == true) {
                  btAlignedFreeInternal(ppNVar6);
                }
                (pCVar13->m_nodes).m_data = (Node **)0x0;
              }
              (pCVar13->m_nodes).m_ownsMemory = true;
              (pCVar13->m_nodes).m_data = ppNVar14;
              (pCVar13->m_nodes).m_capacity = iVar32;
            }
          }
          iVar26 = (pCVar13->m_nodes).m_size;
          (pCVar13->m_nodes).m_data[iVar26] = pNVar30 + lVar22;
          (pCVar13->m_nodes).m_size = iVar26 + 1;
          lVar22 = lVar22 + 1;
        } while (lVar22 < (this->m_nodes).m_size);
      }
      iVar26 = (this->m_clusters).m_size;
      iVar25 = (this->m_clusters).m_capacity;
      if (iVar26 == iVar25) {
        iVar32 = 1;
        if (iVar26 != 0) {
          iVar32 = iVar26 * 2;
        }
        if (iVar25 < iVar32) {
          if (iVar32 == 0) {
            ppCVar11 = (Cluster **)0x0;
          }
          else {
            ppCVar11 = (Cluster **)btAlignedAllocInternal((long)iVar32 << 3,0x10);
          }
          lVar22 = (long)(this->m_clusters).m_size;
          if (0 < lVar22) {
            lVar12 = 0;
            do {
              ppCVar11[lVar12] = (this->m_clusters).m_data[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar22 != lVar12);
          }
          ppCVar5 = (this->m_clusters).m_data;
          if (ppCVar5 != (Cluster **)0x0) {
            if ((this->m_clusters).m_ownsMemory == true) {
              btAlignedFreeInternal(ppCVar5);
            }
            (this->m_clusters).m_data = (Cluster **)0x0;
          }
          (this->m_clusters).m_ownsMemory = true;
          (this->m_clusters).m_data = ppCVar11;
          (this->m_clusters).m_capacity = iVar32;
        }
      }
      iVar26 = (this->m_clusters).m_size;
      (this->m_clusters).m_data[iVar26] = pCVar13;
      (this->m_clusters).m_size = iVar26 + 1;
      ppCVar11 = (this->m_clusters).m_data;
      pCVar13 = *ppCVar11;
      *ppCVar11 = ppCVar11[iVar26];
      ppCVar11[iVar26] = pCVar13;
    }
    if (0 < (this->m_clusters).m_size) {
      iVar26 = 0;
      do {
        if (((this->m_clusters).m_data[iVar26]->m_nodes).m_size == 0) {
          releaseCluster(this,iVar26);
          iVar26 = iVar26 + -1;
        }
        iVar26 = iVar26 + 1;
      } while (iVar26 < (this->m_clusters).m_size);
    }
    btAlignedObjectArray<int>::~btAlignedObjectArray(&local_c0);
    btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_e0);
  }
  if ((this->m_clusters).m_size != 0) {
    initializeClusters(this);
    updateClusters(this);
    iVar26 = (this->m_clusters).m_size;
    uVar21 = iVar26 * iVar26;
    iVar25 = (this->m_clusterConnectivity).m_size;
    if ((iVar25 <= (int)uVar21) && (iVar25 < (int)uVar21)) {
      if ((this->m_clusterConnectivity).m_capacity < (int)uVar21) {
        if (iVar26 == 0) {
          pbVar17 = (bool *)0x0;
        }
        else {
          pbVar17 = (bool *)btAlignedAllocInternal((ulong)uVar21,0x10);
        }
        lVar22 = (long)(this->m_clusterConnectivity).m_size;
        if (0 < lVar22) {
          pbVar9 = (this->m_clusterConnectivity).m_data;
          lVar12 = 0;
          do {
            pbVar17[lVar12] = pbVar9[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar22 != lVar12);
        }
        pbVar9 = (this->m_clusterConnectivity).m_data;
        if (pbVar9 != (bool *)0x0) {
          if ((this->m_clusterConnectivity).m_ownsMemory == true) {
            btAlignedFreeInternal(pbVar9);
          }
          (this->m_clusterConnectivity).m_data = (bool *)0x0;
        }
        (this->m_clusterConnectivity).m_ownsMemory = true;
        (this->m_clusterConnectivity).m_data = pbVar17;
        (this->m_clusterConnectivity).m_capacity = uVar21;
      }
      if (iVar25 < (int)uVar21) {
        memset((this->m_clusterConnectivity).m_data + iVar25,0,(ulong)uVar21 - (long)iVar25);
      }
    }
    (this->m_clusterConnectivity).m_size = uVar21;
    lVar22 = (long)(this->m_clusters).m_size;
    if (0 < lVar22) {
      ppCVar11 = (this->m_clusters).m_data;
      pbVar17 = (this->m_clusterConnectivity).m_data;
      lVar12 = 0;
      do {
        pCVar13 = ppCVar11[lVar12];
        pCVar13->m_clusterIndex = (int)lVar12;
        uVar21 = (pCVar13->m_nodes).m_size;
        if ((int)uVar21 < 1) {
          uVar21 = 0;
        }
        lVar18 = 0;
        do {
          pCVar10 = ppCVar11[lVar18];
          uVar29 = 0;
          bVar20 = false;
          do {
            if (uVar29 == uVar21) break;
            lVar19 = (long)(pCVar10->m_nodes).m_size;
            if (0 < lVar19) {
              lVar28 = 0;
              do {
                if ((pCVar13->m_nodes).m_data[uVar29] == (pCVar10->m_nodes).m_data[lVar28]) {
                  bVar20 = true;
                  break;
                }
                lVar28 = lVar28 + 1;
              } while (lVar19 != lVar28);
            }
            uVar29 = uVar29 + 1;
          } while (!bVar20);
          pbVar17[lVar18 * lVar22 + lVar12] = bVar20;
          lVar18 = lVar18 + 1;
        } while (lVar18 != lVar22);
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar22);
    }
  }
  return (this->m_clusters).m_size;
}

Assistant:

int				btSoftBody::generateClusters(int k,int maxiterations)
{
	int i;
	releaseClusters();
	m_clusters.resize(btMin(k,m_nodes.size()));
	for(i=0;i<m_clusters.size();++i)
	{
		m_clusters[i]			=	new(btAlignedAlloc(sizeof(Cluster),16)) Cluster();
		m_clusters[i]->m_collide=	true;
	}
	k=m_clusters.size();
	if(k>0)
	{
		/* Initialize		*/ 
		btAlignedObjectArray<btVector3>	centers;
		btVector3						cog(0,0,0);
		int								i;
		for(i=0;i<m_nodes.size();++i)
		{
			cog+=m_nodes[i].m_x;
			m_clusters[(i*29873)%m_clusters.size()]->m_nodes.push_back(&m_nodes[i]);
		}
		cog/=(btScalar)m_nodes.size();
		centers.resize(k,cog);
		/* Iterate			*/ 
		const btScalar	slope=16;
		bool			changed;
		int				iterations=0;
		do	{
			const btScalar	w=2-btMin<btScalar>(1,iterations/slope);
			changed=false;
			iterations++;	
			int i;

			for(i=0;i<k;++i)
			{
				btVector3	c(0,0,0);
				for(int j=0;j<m_clusters[i]->m_nodes.size();++j)
				{
					c+=m_clusters[i]->m_nodes[j]->m_x;
				}
				if(m_clusters[i]->m_nodes.size())
				{
					c			/=	(btScalar)m_clusters[i]->m_nodes.size();
					c			=	centers[i]+(c-centers[i])*w;
					changed		|=	((c-centers[i]).length2()>SIMD_EPSILON);
					centers[i]	=	c;
					m_clusters[i]->m_nodes.resize(0);
				}			
			}
			for(i=0;i<m_nodes.size();++i)
			{
				const btVector3	nx=m_nodes[i].m_x;
				int				kbest=0;
				btScalar		kdist=ClusterMetric(centers[0],nx);
				for(int j=1;j<k;++j)
				{
					const btScalar	d=ClusterMetric(centers[j],nx);
					if(d<kdist)
					{
						kbest=j;
						kdist=d;
					}
				}
				m_clusters[kbest]->m_nodes.push_back(&m_nodes[i]);
			}		
		} while(changed&&(iterations<maxiterations));
		/* Merge		*/ 
		btAlignedObjectArray<int>	cids;
		cids.resize(m_nodes.size(),-1);
		for(i=0;i<m_clusters.size();++i)
		{
			for(int j=0;j<m_clusters[i]->m_nodes.size();++j)
			{
				cids[int(m_clusters[i]->m_nodes[j]-&m_nodes[0])]=i;
			}
		}
		for(i=0;i<m_faces.size();++i)
		{
			const int idx[]={	int(m_faces[i].m_n[0]-&m_nodes[0]),
				int(m_faces[i].m_n[1]-&m_nodes[0]),
				int(m_faces[i].m_n[2]-&m_nodes[0])};
			for(int j=0;j<3;++j)
			{
				const int cid=cids[idx[j]];
				for(int q=1;q<3;++q)
				{
					const int kid=idx[(j+q)%3];
					if(cids[kid]!=cid)
					{
						if(m_clusters[cid]->m_nodes.findLinearSearch(&m_nodes[kid])==m_clusters[cid]->m_nodes.size())
						{
							m_clusters[cid]->m_nodes.push_back(&m_nodes[kid]);
						}
					}
				}
			}
		}
		/* Master		*/ 
		if(m_clusters.size()>1)
		{
			Cluster*	pmaster=new(btAlignedAlloc(sizeof(Cluster),16)) Cluster();
			pmaster->m_collide	=	false;
			pmaster->m_nodes.reserve(m_nodes.size());
			for(int i=0;i<m_nodes.size();++i) pmaster->m_nodes.push_back(&m_nodes[i]);
			m_clusters.push_back(pmaster);
			btSwap(m_clusters[0],m_clusters[m_clusters.size()-1]);
		}
		/* Terminate	*/ 
		for(i=0;i<m_clusters.size();++i)
		{
			if(m_clusters[i]->m_nodes.size()==0)
			{
				releaseCluster(i--);
			}
		}
	} else
	{
		//create a cluster for each tetrahedron (if tetrahedra exist) or each face
		if (m_tetras.size())
		{
			m_clusters.resize(m_tetras.size());
			for(i=0;i<m_clusters.size();++i)
			{
				m_clusters[i]			=	new(btAlignedAlloc(sizeof(Cluster),16)) Cluster();
				m_clusters[i]->m_collide=	true;
			}
			for (i=0;i<m_tetras.size();i++)
			{
				for (int j=0;j<4;j++)
				{
					m_clusters[i]->m_nodes.push_back(m_tetras[i].m_n[j]);
				}
			}

		} else
		{
			m_clusters.resize(m_faces.size());
			for(i=0;i<m_clusters.size();++i)
			{
				m_clusters[i]			=	new(btAlignedAlloc(sizeof(Cluster),16)) Cluster();
				m_clusters[i]->m_collide=	true;
			}

			for(i=0;i<m_faces.size();++i)
			{
				for(int j=0;j<3;++j)
				{
					m_clusters[i]->m_nodes.push_back(m_faces[i].m_n[j]);
				}
			}
		}
	}

	if (m_clusters.size())
	{
		initializeClusters();
		updateClusters();


		//for self-collision
		m_clusterConnectivity.resize(m_clusters.size()*m_clusters.size());
		{
			for (int c0=0;c0<m_clusters.size();c0++)
			{
				m_clusters[c0]->m_clusterIndex=c0;
				for (int c1=0;c1<m_clusters.size();c1++)
				{
					
					bool connected=false;
					Cluster* cla = m_clusters[c0];
					Cluster* clb = m_clusters[c1];
					for (int i=0;!connected&&i<cla->m_nodes.size();i++)
					{
						for (int j=0;j<clb->m_nodes.size();j++)
						{
							if (cla->m_nodes[i] == clb->m_nodes[j])
							{
								connected=true;
								break;
							}
						}
					}
					m_clusterConnectivity[c0+c1*m_clusters.size()]=connected;
				}
			}
		}
	}

	return(m_clusters.size());
}